

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol
          (DescriptorBuilder *this,string_view name,bool build_it)

{
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_00;
  bool bVar1;
  reference ppFVar2;
  DescriptorBuilder *this_01;
  anon_union_8_1_a8a14541_for_iterator_2 *this_02;
  iterator iVar3;
  Symbol result;
  FileDescriptor *file;
  iterator __begin3;
  Symbol local_68;
  FileDescriptor *local_60;
  anon_union_8_1_a8a14541_for_iterator_2 local_58;
  anon_union_8_1_a8a14541_for_iterator_2 local_50;
  slot_type local_48 [2];
  iterator local_38;
  
  local_50 = local_58;
  local_68 = FindSymbolNotEnforcingDeps(this,name,build_it);
  if ((((local_68.ptr_)->symbol_type_ != '\0') && (this->pool_->enforce_dependencies_ != false)) &&
     (local_60 = Symbol::GetFile(&local_68), local_60 != this->file_)) {
    this_00 = &this->dependencies_;
    iVar3 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::find<google::protobuf::FileDescriptor_const*>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)this_00,&local_60);
    this_01 = (DescriptorBuilder *)this_00;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::AssertNotDebugCapacity
              (&this_00->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              );
    if (iVar3.ctrl_ == (ctrl_t *)0x0) {
      if ((byte)((local_68.ptr_)->symbol_type_ - 9) < 2) {
        bVar1 = IsInPackage(this_01,this->file_,name);
        if (bVar1) {
          return (Symbol)local_68.ptr_;
        }
        _local_58 = absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ::begin(&this_00->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           );
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::AssertNotDebugCapacity
                  (&this_00->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  );
        local_38.ctrl_ = (ctrl_t *)0x0;
        bVar1 = absl::lts_20250127::container_internal::operator==((iterator *)&local_58,&local_38);
        if (!bVar1) {
          do {
            this_02 = &local_58;
            ppFVar2 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ::iterator::operator*((iterator *)&local_58);
            if ((*ppFVar2 != (FileDescriptor *)0x0) &&
               (bVar1 = IsInPackage((DescriptorBuilder *)this_02,*ppFVar2,name), bVar1)) {
              return (Symbol)local_68.ptr_;
            }
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::iterator::operator++((iterator *)&local_58);
            bVar1 = absl::lts_20250127::container_internal::operator==
                              ((iterator *)&local_58,&local_38);
          } while (!bVar1);
        }
      }
      this->possible_undeclared_dependency_ = local_60;
      local_58.slot_ = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,name._M_str,name._M_str + name._M_len);
      std::__cxx11::string::operator=
                ((string *)&this->possible_undeclared_dependency_name_,(string *)&local_58);
      if (local_58.slot_ != local_48) {
        operator_delete(local_58.slot_,(ulong)&local_48[0]->is_placeholder_);
      }
      local_68.ptr_ = (SymbolBase *)&Symbol::Symbol()::null_symbol;
    }
  }
  return (Symbol)local_68.ptr_;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const absl::string_view name,
                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.contains(file)) {
    return result;
  }

  if (result.IsPackage()) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (const auto* dep : dependencies_) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (dep != nullptr && IsInPackage(dep, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = std::string(name);
  return Symbol();
}